

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::Material::Material
          (Material *this,uint64_t id,Element *element,Document *doc,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Connection *this_01;
  _Alloc_hider _Var3;
  int iVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_02;
  const_iterator cVar5;
  Token *pTVar6;
  Object *pOVar7;
  mapped_type pTVar8;
  iterator iVar9;
  mapped_type *ppTVar10;
  LayeredTexture *this_03;
  iterator iVar11;
  mapped_type *ppLVar12;
  char *pcVar13;
  Token *t;
  _Rb_tree_header *p_Var14;
  pointer ppCVar15;
  Element *el;
  size_type sVar16;
  string *prop;
  Element *el_00;
  string *psVar17;
  string templateName;
  key_type local_e0;
  Element *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  LayeredTextureMap *local_90;
  Document *local_88;
  TextureMap *local_80;
  Material *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  pointer local_50;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_48
  ;
  
  local_88 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_008e4910;
  psVar17 = &this->shading;
  local_70 = &(this->shading).field_2;
  (this->shading)._M_dataplus._M_p = (pointer)local_70;
  (this->shading)._M_string_length = 0;
  (this->shading).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80 = &this->textures;
  local_58 = &(this->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = &this->layeredTextures;
  local_60 = &(this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = element;
  local_78 = this;
  local_68 = psVar17;
  this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ShadingModel","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_02,&local_e0);
  p_Var14 = &(this_02->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var14) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"MultiLayer","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_02,&local_e0);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var14) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (el != (Element *)0x0) {
    pTVar6 = GetRequiredToken(el,0);
    iVar4 = ParseTokenAsInt(pTVar6);
    this->multilayer = iVar4 != 0;
  }
  if (el_00 == (Element *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"shading mode not specified, assuming phong","");
    Util::DOMWarning(&local_e0,local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_replace
              ((ulong)psVar17,0,(char *)(this->shading)._M_string_length,0x703797);
  }
  else {
    pTVar6 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(&local_e0,(FBX *)pTVar6,t);
    std::__cxx11::string::operator=((string *)psVar17,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  sVar1 = (this->shading)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->shading)._M_dataplus._M_p;
    sVar16 = 0;
    do {
      iVar4 = tolower((int)pcVar2[sVar16]);
      pcVar2[sVar16] = (char)iVar4;
      sVar16 = sVar16 + 1;
    } while (sVar1 != sVar16);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar17);
  if (iVar4 == 0) {
    pcVar13 = "Material.FbxSurfacePhong";
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)psVar17);
    if (iVar4 != 0) {
      std::operator+(&local_b8,"shading mode not recognized: ",psVar17);
      Util::DOMWarning(&local_b8,local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      goto LAB_0060eecd;
    }
    pcVar13 = "Material.FbxSurfaceLambert";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_e0,0,(char *)local_e0._M_string_length,(ulong)pcVar13);
LAB_0060eecd:
  Util::GetPropertyTable((Util *)&local_b8,local_88,&local_e0,local_c0,(Scope *)this_02,false);
  sVar1 = local_b8._M_string_length;
  _Var3._M_p = local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)_Var3._M_p;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
  }
  Document::GetConnectionsByDestinationSequenced(&local_48,local_88,(this->super_Object).id);
  local_50 = local_48.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppCVar15 = local_48.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_01 = *ppCVar15;
      if ((this_01->prop)._M_string_length != 0) {
        pOVar7 = Connection::SourceObject(this_01);
        if (pOVar7 == (Object *)0x0) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"failed to read source object for texture link, ignoring",
                     "");
          Util::DOMWarning(&local_b8,local_c0);
LAB_0060f031:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
        }
        else {
          psVar17 = &this_01->prop;
          pTVar8 = (mapped_type)__dynamic_cast(pOVar7,&Object::typeinfo,&Texture::typeinfo,0);
          if (pTVar8 == (mapped_type)0x0) {
            this_03 = (LayeredTexture *)
                      __dynamic_cast(pOVar7,&Object::typeinfo,&LayeredTexture::typeinfo,0);
            if (this_03 == (LayeredTexture *)0x0) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,
                         "source object for texture link is not a texture or layered texture, ignoring"
                         ,"");
              Util::DOMWarning(&local_b8,local_c0);
              goto LAB_0060f031;
            }
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                     ::find(&local_90->_M_t,psVar17);
            if (iVar11._M_node != local_60) {
              std::operator+(&local_b8,"duplicate layered texture link: ",psVar17);
              Util::DOMWarning(&local_b8,local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
            }
            ppLVar12 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                       ::operator[](local_90,psVar17);
            *ppLVar12 = this_03;
            LayeredTexture::fillTexture(this_03,local_88);
          }
          else {
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                    ::find(&local_80->_M_t,psVar17);
            if (iVar9._M_node != local_58) {
              std::operator+(&local_b8,"duplicate texture link: ",psVar17);
              Util::DOMWarning(&local_b8,local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
            }
            ppTVar10 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                       ::operator[](local_80,psVar17);
            *ppTVar10 = pTVar8;
          }
        }
      }
      ppCVar15 = ppCVar15 + 1;
    } while (ppCVar15 != local_50);
  }
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

Material::Material(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const ShadingModel = sc["ShadingModel"];
    const Element* const MultiLayer = sc["MultiLayer"];

    if(MultiLayer) {
        multilayer = !!ParseTokenAsInt(GetRequiredToken(*MultiLayer,0));
    }

    if(ShadingModel) {
        shading = ParseTokenAsString(GetRequiredToken(*ShadingModel,0));
    }
    else {
        DOMWarning("shading mode not specified, assuming phong",&element);
        shading = "phong";
    }

    std::string templateName;

    // lower-case shading because Blender (for example) writes "Phong"
    std::transform(shading.begin(), shading.end(), shading.begin(), ::tolower);
    if(shading == "phong") {
        templateName = "Material.FbxSurfacePhong";
    }
    else if(shading == "lambert") {
        templateName = "Material.FbxSurfaceLambert";
    }
    else {
        DOMWarning("shading mode not recognized: " + shading,&element);
    }

    props = GetPropertyTable(doc,templateName,element,sc);

    // resolve texture links
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(const Connection* con : conns) {

        // texture link to properties, not objects
        if (!con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);
        if(!tex) {
            const LayeredTexture* const layeredTexture = dynamic_cast<const LayeredTexture*>(ob);
            if(!layeredTexture) {
                DOMWarning("source object for texture link is not a texture or layered texture, ignoring",&element);
                continue;
            }
            const std::string& prop = con->PropertyName();
            if (layeredTextures.find(prop) != layeredTextures.end()) {
                DOMWarning("duplicate layered texture link: " + prop,&element);
            }

            layeredTextures[prop] = layeredTexture;
            ((LayeredTexture*)layeredTexture)->fillTexture(doc);
        }
        else
        {
            const std::string& prop = con->PropertyName();
            if (textures.find(prop) != textures.end()) {
                DOMWarning("duplicate texture link: " + prop,&element);
            }

            textures[prop] = tex;
        }

    }
}